

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O1

int __thiscall Qclass::plot(Qclass *this)

{
  long *plVar1;
  ostream *poVar2;
  char *ctx;
  undefined1 local_e0 [8];
  Gnuplot g1;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  ctx = "lines";
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"lines","");
  g1._8_8_ = &g1.pstyle._M_string_length;
  local_e0 = (undefined1  [8])0x0;
  g1.gnucmd._0_2_ = 0;
  g1.gnucmd._4_4_ = 0;
  g1.pstyle._M_dataplus._M_p = (pointer)0x0;
  g1.pstyle._M_string_length._0_1_ = 0;
  g1.pstyle.field_2._8_8_ = &g1.smooth._M_string_length;
  g1.smooth._M_dataplus._M_p = (pointer)0x0;
  g1.smooth._M_string_length._0_1_ = 0;
  g1.smooth.field_2._8_8_ = 0;
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Gnuplot::init((Gnuplot *)local_e0,(EVP_PKEY_CTX *)ctx);
  Gnuplot::set_style((Gnuplot *)local_e0,(string *)(local_68 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  Gnuplot::set_xrange((Gnuplot *)local_e0,-10.0,60.0);
  Gnuplot::set_yrange((Gnuplot *)local_e0,-10.0,60.0);
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"Co_ordinates.txt","")
  ;
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Path","");
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_e0,(string *)(local_68 + 0x10),1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (g1.tmpfile_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_68) {
    operator_delete(g1.tmpfile_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_68._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"Obstacles1.txt","");
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Obstacles","");
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_e0,(string *)(local_68 + 0x10),1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (g1.tmpfile_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_68) {
    operator_delete(g1.tmpfile_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_68._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  local_58._M_allocated_capacity = (size_type)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"Obstacles2.txt","");
  g1.tmpfile_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Obstacles","");
  Gnuplot::plotfile_xy
            ((Gnuplot *)local_e0,(string *)(local_68 + 0x10),1,2,
             (string *)
             &g1.tmpfile_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (g1.tmpfile_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_68) {
    operator_delete(g1.tmpfile_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(local_68._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_allocated_capacity != &local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Press ENTER to continue...",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x157590);
  plVar1 = *(long **)(*(long *)(std::cin + -0x18) + 0x157678);
  if (plVar1[3] == plVar1[2]) {
    (**(code **)(*plVar1 + 0x38))();
  }
  std::istream::ignore((long)&std::cin);
  std::istream::get();
  Gnuplot::~Gnuplot((Gnuplot *)local_e0);
  return 0;
}

Assistant:

int Qclass::plot() {
  try {
    Gnuplot g1("lines");
    // Plots points present in Text files
    g1.set_xrange(-10, 60);
    g1.set_yrange(-10, 60);
    g1.plotfile_xy("Co_ordinates.txt", 1, 2, "Path");
    g1.plotfile_xy("Obstacles1.txt", 1, 2, "Obstacles");
    g1.plotfile_xy("Obstacles2.txt", 1, 2, "Obstacles");

#if defined(unix) || defined(__unix) || defined(__unix__) || defined(__APPLE__)
    std::cout << std::endl << "Press ENTER to continue..." << std::endl;

    std::cin.clear();
    std::cin.ignore(std::cin.rdbuf()->in_avail());
    std::cin.get();
#endif
  } catch (GnuplotException& ge) {
    // std::cout << ge.what() << std::endl;
  }
  return 0;
}